

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int flow_set_available(FLOW_HANDLE flow,uint32_t available_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  FLOW_INSTANCE *flow_instance;
  
  if (flow == (FLOW_HANDLE)0x0) {
    iVar2 = 0x1962;
  }
  else {
    item_value = amqpvalue_create_uint(available_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x196a;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(flow->composite_value,7,item_value);
      iVar2 = 0x1970;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int flow_set_available(FLOW_HANDLE flow, uint32_t available_value)
{
    int result;

    if (flow == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        AMQP_VALUE available_amqp_value = amqpvalue_create_uint(available_value);
        if (available_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(flow_instance->composite_value, 7, available_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(available_amqp_value);
        }
    }

    return result;
}